

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webmdec.cc
# Opt level: O3

int webm_read_frame(WebmInputContext *webm_ctx,uint8_t **buffer,size_t *bytes_read,
                   size_t *buffer_size)

{
  bool bVar1;
  uint8_t **ppuVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  longlong lVar6;
  Cluster *pCurr;
  Block *this;
  Frame *this_00;
  uint8_t *puVar7;
  long lVar8;
  ulong uVar9;
  size_t sVar10;
  BlockEntry *block_entry;
  BlockEntry *local_58;
  uint8_t **local_50;
  size_t *local_48;
  size_t *local_40;
  Segment *local_38;
  undefined4 extraout_var;
  
  iVar4 = 1;
  if (webm_ctx->reached_eos == 0) {
    local_38 = (Segment *)webm_ctx->segment;
    pCurr = (Cluster *)webm_ctx->cluster;
    this = (Block *)webm_ctx->block;
    local_58 = (BlockEntry *)webm_ctx->block_entry;
    local_50 = buffer;
    local_48 = buffer_size;
    local_40 = bytes_read;
    bVar3 = false;
LAB_0012335e:
    do {
      bVar1 = bVar3;
      if (local_58 == (BlockEntry *)0x0) {
        if (bVar1) goto LAB_001233b8;
LAB_001233e3:
        lVar8 = mkvparser::Cluster::GetFirst(pCurr,&local_58);
LAB_001233f1:
        if (lVar8 != 0) {
          return -1;
        }
        if (local_58 == (BlockEntry *)0x0) {
          return -1;
        }
        iVar4 = (*local_58->_vptr_BlockEntry[2])();
        this = (Block *)CONCAT44(extraout_var,iVar4);
        if (this == (Block *)0x0) {
          return -1;
        }
        webm_ctx->block_frame_index = 0;
      }
      else {
        if ((bVar1) || (iVar4 = (*local_58->_vptr_BlockEntry[3])(), iVar4 == 0)) {
LAB_001233b8:
          pCurr = mkvparser::Segment::GetNext(local_38,pCurr);
          if ((pCurr == (Cluster *)0x0) || (bVar3 = mkvparser::Cluster::EOS(pCurr), bVar3)) {
            *local_40 = 0;
            webm_ctx->reached_eos = 1;
            return 1;
          }
          bVar1 = false;
          goto LAB_001233e3;
        }
        if (((this == (Block *)0x0) ||
            (iVar4 = webm_ctx->block_frame_index, iVar5 = mkvparser::Block::GetFrameCount(this),
            iVar4 == iVar5)) ||
           (lVar6 = mkvparser::Block::GetTrackNumber(this), lVar6 != webm_ctx->video_track_index)) {
          lVar8 = mkvparser::Cluster::GetNext(pCurr,local_58,&local_58);
          bVar3 = true;
          if ((local_58 != (BlockEntry *)0x0) &&
             (iVar4 = (*local_58->_vptr_BlockEntry[3])(), iVar4 != 0)) goto LAB_001233f1;
          goto LAB_0012335e;
        }
        if (local_58 == (BlockEntry *)0x0) {
          return -1;
        }
      }
      bVar3 = bVar1;
    } while ((bVar1) ||
            (lVar6 = mkvparser::Block::GetTrackNumber(this), lVar6 != webm_ctx->video_track_index));
    webm_ctx->cluster = pCurr;
    webm_ctx->block_entry = local_58;
    webm_ctx->block = this;
    this_00 = mkvparser::Block::GetFrame(this,webm_ctx->block_frame_index);
    ppuVar2 = local_50;
    webm_ctx->block_frame_index = webm_ctx->block_frame_index + 1;
    sVar10 = this_00->len;
    if ((long)*local_48 < (long)sVar10) {
      if (*local_50 != (uint8_t *)0x0) {
        operator_delete__(*local_50);
        sVar10 = this_00->len;
      }
      uVar9 = 0xffffffffffffffff;
      if (-1 < (long)sVar10) {
        uVar9 = sVar10;
      }
      puVar7 = (uint8_t *)operator_new__(uVar9);
      *ppuVar2 = puVar7;
      webm_ctx->buffer = puVar7;
      if (*ppuVar2 == (uint8_t *)0x0) {
        return -1;
      }
      *local_48 = sVar10;
      sVar10 = this_00->len;
    }
    *local_40 = sVar10;
    lVar6 = mkvparser::Block::GetTime(this,pCurr);
    webm_ctx->timestamp_ns = lVar6;
    bVar3 = mkvparser::Block::IsKey(this);
    webm_ctx->is_key_frame = (uint)bVar3;
    lVar8 = mkvparser::Block::Frame::Read(this_00,(IMkvReader *)webm_ctx->reader,*ppuVar2);
    iVar4 = -(uint)(lVar8 != 0);
  }
  return iVar4;
}

Assistant:

int webm_read_frame(struct WebmInputContext *webm_ctx, uint8_t **buffer,
                    size_t *bytes_read, size_t *buffer_size) {
  assert(webm_ctx->buffer == *buffer);
  // This check is needed for frame parallel decoding, in which case this
  // function could be called even after it has reached end of input stream.
  if (webm_ctx->reached_eos) {
    return 1;
  }
  mkvparser::Segment *const segment =
      reinterpret_cast<mkvparser::Segment *>(webm_ctx->segment);
  const mkvparser::Cluster *cluster =
      reinterpret_cast<const mkvparser::Cluster *>(webm_ctx->cluster);
  const mkvparser::Block *block =
      reinterpret_cast<const mkvparser::Block *>(webm_ctx->block);
  const mkvparser::BlockEntry *block_entry =
      reinterpret_cast<const mkvparser::BlockEntry *>(webm_ctx->block_entry);
  bool block_entry_eos = false;
  do {
    long status = 0;
    bool get_new_block = false;
    if (block_entry == NULL && !block_entry_eos) {
      status = cluster->GetFirst(block_entry);
      get_new_block = true;
    } else if (block_entry_eos || block_entry->EOS()) {
      cluster = segment->GetNext(cluster);
      if (cluster == NULL || cluster->EOS()) {
        *bytes_read = 0;
        webm_ctx->reached_eos = 1;
        return 1;
      }
      status = cluster->GetFirst(block_entry);
      block_entry_eos = false;
      get_new_block = true;
    } else if (block == NULL ||
               webm_ctx->block_frame_index == block->GetFrameCount() ||
               block->GetTrackNumber() != webm_ctx->video_track_index) {
      status = cluster->GetNext(block_entry, block_entry);
      if (block_entry == NULL || block_entry->EOS()) {
        block_entry_eos = true;
        continue;
      }
      get_new_block = true;
    }
    if (status || block_entry == NULL) {
      return -1;
    }
    if (get_new_block) {
      block = block_entry->GetBlock();
      if (block == NULL) return -1;
      webm_ctx->block_frame_index = 0;
    }
  } while (block_entry_eos ||
           block->GetTrackNumber() != webm_ctx->video_track_index);

  webm_ctx->cluster = cluster;
  webm_ctx->block_entry = block_entry;
  webm_ctx->block = block;

  const mkvparser::Block::Frame &frame =
      block->GetFrame(webm_ctx->block_frame_index);
  ++webm_ctx->block_frame_index;
  if (frame.len > static_cast<long>(*buffer_size)) {
    delete[] * buffer;
    *buffer = new uint8_t[frame.len];
    webm_ctx->buffer = *buffer;
    if (*buffer == NULL) {
      return -1;
    }
    *buffer_size = frame.len;
  }
  *bytes_read = frame.len;
  webm_ctx->timestamp_ns = block->GetTime(cluster);
  webm_ctx->is_key_frame = block->IsKey();

  mkvparser::MkvReader *const reader =
      reinterpret_cast<mkvparser::MkvReader *>(webm_ctx->reader);
  return frame.Read(reader, *buffer) ? -1 : 0;
}